

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Acec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  Abc_Frame_t *pAbc_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  Gia_Man_t **ppGVar5;
  Gia_Man_t *pGVar6;
  FILE *pFVar7;
  Gia_Man_t *pGVar8;
  Gia_Man_t *pGVar9;
  int *piVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  Gia_Man_t **ppGVar14;
  bool bVar15;
  Gia_Man_t *pGia1;
  Acec_ParCec_t ParsCec;
  Gia_Man_t *pGia0;
  Gia_Man_t *local_88 [2];
  Acec_ParCec_t local_78;
  Abc_Frame_t *local_50;
  Gia_Man_t *local_48 [3];
  
  ppGVar14 = local_88;
  local_50 = pAbc;
  Acec_ManCecSetDefaultParams(&local_78);
  Extra_UtilGetoptReset();
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"CTmdtbvh"), pAbc_00 = local_50,
          iVar4 = globalUtilOptind, 99 < iVar2) {
      if (iVar2 < 0x74) {
        piVar10 = &local_78.fDualOutput;
        if ((iVar2 != 100) && (piVar10 = &local_78.fMiter, iVar2 != 0x6d)) goto LAB_00290027;
      }
      else {
        piVar10 = &local_78.fTwoOutput;
        if (iVar2 != 0x74) {
          if (iVar2 != 0x76) goto LAB_00290027;
          piVar10 = &local_78.fVerbose;
        }
      }
LAB_0028ff2f:
      *(byte *)piVar10 = (byte)*piVar10 ^ 1;
    }
    if (iVar2 < 0x54) {
      if (iVar2 != 0x43) {
        if (iVar2 == -1) {
          if (local_78.fMiter == 0) {
            if ((uint)(argc - globalUtilOptind) < 2) {
              if (argc != globalUtilOptind) {
                pcVar11 = argv[globalUtilOptind];
                pcVar12 = pcVar11;
                goto LAB_002902cd;
              }
              pcVar11 = local_50->pGia->pSpec;
              if (pcVar11 != (char *)0x0) goto LAB_0029030f;
              pcVar11 = "File name is not given on the command line.\n";
            }
            else {
              if (argc - globalUtilOptind == 2) {
                lVar13 = 0;
                local_88[0] = (Gia_Man_t *)0x0;
                local_48[2] = (Gia_Man_t *)0x0;
                ppGVar5 = local_48;
                local_48[0] = (Gia_Man_t *)argv[globalUtilOptind];
                local_48[1] = (Gia_Man_t *)(argv + globalUtilOptind)[1];
                bVar15 = true;
                break;
              }
              pcVar11 = "Too many command-line arguments.\n";
            }
          }
          else if (globalUtilOptind == argc) {
            pGVar9 = local_50->pGia;
            if (pGVar9 == (Gia_Man_t *)0x0) {
              pcVar11 = "Abc_CommandAbc9Acec(): There is no AIG.\n";
            }
            else if (local_78.fDualOutput == 0) {
              if (local_78.fTwoOutput == 0) {
                if (local_78.fSilent == 0) {
                  Abc_Print(1,
                            "Assuming the current network is a regular single- or multi-output miter. (Conflict limit = %d.)\n"
                            ,(ulong)(uint)local_78.nBTLimit);
                  pGVar9 = pAbc_00->pGia;
                }
                pGVar9 = Gia_ManDemiterToDual(pGVar9);
                Gia_ManDemiterDual(pGVar9,local_48,local_88);
                Gia_ManStop(pGVar9);
LAB_002904d0:
                iVar4 = Acec_Solve(local_48[0],local_88[0],&local_78);
                pAbc_00->Status = iVar4;
                Abc_FrameReplaceCex(pAbc_00,&local_48[0]->pCexComb);
                Gia_ManStop(local_48[0]);
                Gia_ManStop(local_88[0]);
                return 0;
              }
              if ((pGVar9->vCos->nSize - pGVar9->nRegs & 1U) == 0) {
                if (local_78.fSilent == 0) {
                  Abc_Print(1,
                            "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n"
                            ,(ulong)(uint)local_78.nBTLimit);
                  pGVar9 = pAbc_00->pGia;
                }
                Gia_ManDemiterTwoWords(pGVar9,local_48,local_88);
                goto LAB_002904d0;
              }
              pcVar11 = "The two-output miter should have an even number of outputs.\n";
            }
            else {
              if ((pGVar9->vCos->nSize - pGVar9->nRegs & 1U) == 0) {
                if (local_78.fSilent == 0) {
                  Abc_Print(1,
                            "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n"
                            ,(ulong)(uint)local_78.nBTLimit);
                  pGVar9 = pAbc_00->pGia;
                }
                Gia_ManDemiterDual(pGVar9,local_48,local_88);
                goto LAB_002904d0;
              }
              pcVar11 = "The dual-output miter should have an even number of outputs.\n";
            }
          }
          else {
            pcVar11 = 
            "Abc_CommandAbc9Acec(): If the input is a miter, it cannot be given on the command line.\n"
            ;
          }
          iVar4 = -1;
          goto LAB_00290161;
        }
        goto LAB_00290027;
      }
      if (argc <= globalUtilOptind) {
        pcVar11 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_0029001b;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_78.nBTLimit = uVar3;
    }
    else {
      if (iVar2 != 0x54) {
        piVar10 = &local_78.fBooth;
        if (iVar2 == 0x62) goto LAB_0028ff2f;
        goto LAB_00290027;
      }
      if (argc <= globalUtilOptind) {
        pcVar11 = "Command line switch \"-T\" should be followed by an integer.\n";
LAB_0029001b:
        Abc_Print(-1,pcVar11);
        goto LAB_00290027;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_78.TimeLimit = uVar3;
    }
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar3 < 0) {
LAB_00290027:
      Abc_Print(-2,"usage: &acec [-CT num] [-mdtbvh] <file1> <file2>\n");
      Abc_Print(-2,"\t         combinational equivalence checking for arithmetic circuits\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)local_78.nBTLimit);
      Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                (ulong)(uint)local_78.TimeLimit);
      pcVar11 = "miter";
      if (local_78.fMiter == 0) {
        pcVar11 = "two circuits";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. two circuits [default = %s]\n",pcVar11);
      pcVar12 = "yes";
      pcVar11 = "yes";
      if (local_78.fDualOutput == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using dual output miter [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (local_78.fTwoOutput == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle using two-word miter [default = %s]\n",pcVar11);
      pcVar11 = "yes";
      if (local_78.fBooth == 0) {
        pcVar11 = "no";
      }
      Abc_Print(-2,"\t-b     : toggle working with Booth multipliers [default = %s]\n",pcVar11);
      if (local_78.fVerbose == 0) {
        pcVar12 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar12);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
      pcVar11 = "\tfile2  : (optional) the file with the second network\n";
      iVar4 = -2;
LAB_00290161:
      Abc_Print(iVar4,pcVar11);
      return 1;
    }
  } while( true );
LAB_00290207:
  pGVar9 = *ppGVar5;
  pGVar8 = pGVar9;
  do {
    if (*(char *)&pGVar8->pName == '>') {
      *(char *)&pGVar8->pName = '\\';
    }
    else if (*(char *)&pGVar8->pName == '\0') break;
    pGVar8 = (Gia_Man_t *)((long)&pGVar8->pName + 1);
  } while( true );
  pFVar7 = fopen((char *)pGVar9,"r");
  if (pFVar7 == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",pGVar9);
    pGVar9 = (Gia_Man_t *)
             Extra_FileGetSimilarName
                       ((char *)pGVar9,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    local_48[lVar13] = pGVar9;
    goto LAB_00290446;
  }
  fclose(pFVar7);
  pGVar6 = Gia_AigerRead((char *)pGVar9,0,0,0);
  *ppGVar14 = pGVar6;
  pGVar8 = local_48[2];
  pGVar9 = local_88[0];
  if (pGVar6 == (Gia_Man_t *)0x0) goto LAB_00290362;
  lVar13 = 1;
  ppGVar5 = local_48 + 1;
  ppGVar14 = local_48 + 2;
  bVar1 = !bVar15;
  bVar15 = false;
  if (bVar1) goto code_r0x00290275;
  goto LAB_00290207;
LAB_002902cd:
  if (*pcVar12 == '>') {
    *pcVar12 = '\\';
  }
  else if (*pcVar12 == '\0') goto LAB_002902ef;
  pcVar12 = pcVar12 + 1;
  goto LAB_002902cd;
code_r0x00290275:
  iVar4 = Acec_Solve(local_88[0],local_48[2],&local_78);
  local_50->Status = iVar4;
  Abc_FrameReplaceCex(local_50,&pGVar9->pCexComb);
  Gia_ManStop(pGVar9);
LAB_00290358:
  Gia_ManStop(pGVar8);
  return 0;
LAB_002902ef:
  pFVar7 = fopen(pcVar11,"r");
  if (pFVar7 == (FILE *)0x0) {
    Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar11);
    pGVar9 = (Gia_Man_t *)
             Extra_FileGetSimilarName
                       (pcVar11,".aig",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_00290446:
    if (pGVar9 != (Gia_Man_t *)0x0) {
      Abc_Print(1,"Did you mean \"%s\"?",pGVar9);
    }
    pcVar11 = "\n";
    iVar4 = 1;
    iVar2 = 1;
  }
  else {
    fclose(pFVar7);
LAB_0029030f:
    pGVar8 = Gia_AigerRead(pcVar11,0,0,0);
    if (pGVar8 != (Gia_Man_t *)0x0) {
      iVar4 = Acec_Solve(pAbc_00->pGia,pGVar8,&local_78);
      pAbc_00->Status = iVar4;
      Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexComb);
      goto LAB_00290358;
    }
LAB_00290362:
    pcVar11 = "Reading AIGER has failed.\n";
    iVar4 = 0;
    iVar2 = -1;
  }
  Abc_Print(iVar2,pcVar11);
  return iVar4;
}

Assistant:

int Abc_CommandAbc9Acec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    FILE * pFile;
    Acec_ParCec_t ParsCec, * pPars = &ParsCec;
    char ** pArgvNew;
    int c, nArgcNew;
    Acec_ManCecSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CTmdtbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeLimit < 0 )
                goto usage;
            break;
        case 'm':
            pPars->fMiter ^= 1;
            break;
        case 'd':
            pPars->fDualOutput ^= 1;
            break;
        case 't':
            pPars->fTwoOutput ^= 1;
            break;
        case 'b':
            pPars->fBooth ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pPars->fMiter )
    {
        Gia_Man_t * pGia0, * pGia1, * pDual;
        if ( argc != globalUtilOptind )
        {
            Abc_Print( -1, "Abc_CommandAbc9Acec(): If the input is a miter, it cannot be given on the command line.\n" );
            return 1;
        }
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Acec(): There is no AIG.\n" );
            return 1;
        }
        if ( pPars->fDualOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The dual-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a double-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterDual( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Acec_Solve( pGia0, pGia1, pPars );
        }
        else if ( pPars->fTwoOutput )
        {
            if ( Gia_ManPoNum(pAbc->pGia) & 1 )
            {
                Abc_Print( -1, "The two-output miter should have an even number of outputs.\n" );
                return 1;
            }
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a two-word miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            Gia_ManDemiterTwoWords( pAbc->pGia, &pGia0, &pGia1 );
            pAbc->Status = Acec_Solve( pGia0, pGia1, pPars );
        }
        else // regular single- or multi-output miter
        {
            if ( !pPars->fSilent )
            Abc_Print( 1, "Assuming the current network is a regular single- or multi-output miter. (Conflict limit = %d.)\n", pPars->nBTLimit );
            pDual = Gia_ManDemiterToDual( pAbc->pGia );
            Gia_ManDemiterDual( pDual, &pGia0, &pGia1 );
            Gia_ManStop( pDual );
            pAbc->Status = Acec_Solve( pGia0, pGia1, pPars );
        }
        Abc_FrameReplaceCex( pAbc, &pGia0->pCexComb );
        Gia_ManStop( pGia0 );
        Gia_ManStop( pGia1 );
        return 0;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew == 0 || nArgcNew == 1 )
    {
        Gia_Man_t * pSecond;
        char * pTemp, * FileName = NULL;
        if ( nArgcNew == 0 )
        {
            FileName = pAbc->pGia->pSpec;
            if ( FileName == NULL )
            {
                Abc_Print( -1, "File name is not given on the command line.\n" );
                return 1;
            }
        }
        else // if ( nArgcNew == 1 )
        {
            FileName = pArgvNew[0];
            // fix the wrong symbol
            for ( pTemp = FileName; *pTemp; pTemp++ )
                if ( *pTemp == '>' )
                    *pTemp = '\\';
            if ( (pFile = fopen( FileName, "r" )) == NULL )
            {
                Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
                if ( (FileName = Extra_FileGetSimilarName( FileName, ".aig", NULL, NULL, NULL, NULL )) )
                    Abc_Print( 1, "Did you mean \"%s\"?", FileName );
                Abc_Print( 1, "\n" );
                return 1;
            }
            fclose( pFile );
        }
        pSecond = Gia_AigerRead( FileName, 0, 0, 0 );
        if ( pSecond == NULL )
        {
            Abc_Print( -1, "Reading AIGER has failed.\n" );
            return 0;
        }
        pAbc->Status = Acec_Solve( pAbc->pGia, pSecond, pPars );
        Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexComb );
        Gia_ManStop( pSecond );
    }
    else if ( nArgcNew == 2 )
    {
        Gia_Man_t * pGias[2] = {NULL};  int i;
        char * pTemp, * FileName[2] = { pArgvNew[0], pArgvNew[1] };
        for ( i = 0; i < 2; i++ )
        {
            // fix the wrong symbol
            for ( pTemp = FileName[i]; *pTemp; pTemp++ )
                if ( *pTemp == '>' )
                    *pTemp = '\\';
            if ( (pFile = fopen( FileName[i], "r" )) == NULL )
            {
                Abc_Print( -1, "Cannot open input file \"%s\". ", FileName[i] );
                if ( (FileName[i] = Extra_FileGetSimilarName( FileName[i], ".aig", NULL, NULL, NULL, NULL )) )
                    Abc_Print( 1, "Did you mean \"%s\"?", FileName[i] );
                Abc_Print( 1, "\n" );
                return 1;
            }
            fclose( pFile );
            pGias[i] = Gia_AigerRead( FileName[i], 0, 0, 0 );
            if ( pGias[i] == NULL )
            {
                Abc_Print( -1, "Reading AIGER has failed.\n" );
                return 0;
            }
        }
        pAbc->Status = Acec_Solve( pGias[0], pGias[1], pPars );
        Abc_FrameReplaceCex( pAbc, &pGias[0]->pCexComb );
        Gia_ManStop( pGias[0] );
        Gia_ManStop( pGias[1] );
    }
    else
    {
        Abc_Print( -1, "Too many command-line arguments.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &acec [-CT num] [-mdtbvh] <file1> <file2>\n" );
    Abc_Print( -2, "\t         combinational equivalence checking for arithmetic circuits\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", pPars->TimeLimit );
    Abc_Print( -2, "\t-m     : toggle miter vs. two circuits [default = %s]\n", pPars->fMiter? "miter":"two circuits");
    Abc_Print( -2, "\t-d     : toggle using dual output miter [default = %s]\n", pPars->fDualOutput? "yes":"no");
    Abc_Print( -2, "\t-t     : toggle using two-word miter [default = %s]\n", pPars->fTwoOutput? "yes":"no");
    Abc_Print( -2, "\t-b     : toggle working with Booth multipliers [default = %s]\n", pPars->fBooth? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    return 1;
}